

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlElementPtrWrap(xmlElementPtr elem)

{
  PyObject *ret;
  xmlElementPtr elem_local;
  
  if (elem == (xmlElementPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    elem_local = (xmlElementPtr)&_Py_NoneStruct;
  }
  else {
    elem_local = (xmlElementPtr)PyCapsule_New(elem,"xmlElementPtr",0);
  }
  return (PyObject *)elem_local;
}

Assistant:

PyObject *
libxml_xmlElementPtrWrap(xmlElementPtr elem)
{
    PyObject *ret;

    if (elem == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret = PyCapsule_New((void *) elem, (char *) "xmlElementPtr", NULL);
    return (ret);
}